

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O2

void __thiscall spvtools::opt::IRContext::BuildIdToNameMap(IRContext *this)

{
  Module *pMVar1;
  Instruction *this_00;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
  *this_01;
  pointer __p;
  uint32_t uVar2;
  Instruction *debug_inst;
  Instruction **ppIVar3;
  pointer local_40;
  Instruction *local_38;
  
  MakeUnique<std::multimap<unsigned_int,spvtools::opt::Instruction*,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>>
            ();
  __p = local_40;
  local_40 = (pointer)0x0;
  std::
  __uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
  ::reset((__uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
           *)&this->id_to_name_,__p);
  std::
  unique_ptr<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
  ::~unique_ptr((unique_ptr<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                 *)&local_40);
  pMVar1 = (this->module_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Module,_std::default_delete<spvtools::opt::Module>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Module_*,_std::default_delete<spvtools::opt::Module>_>
           .super__Head_base<0UL,_spvtools::opt::Module_*,_false>._M_head_impl;
  ppIVar3 = (Instruction **)
            ((long)&(pMVar1->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 0x10);
  while (this_00 = *ppIVar3,
        this_00 !=
        (Instruction *)
        ((long)&(pMVar1->debugs2_).super_IntrusiveList<spvtools::opt::Instruction> + 8U)) {
    if (this_00->opcode_ - OpName < 2) {
      this_01 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
                 *)(this->id_to_name_)._M_t.
                   super___uniq_ptr_impl<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_std::default_delete<std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_>_>
                   .
                   super__Head_base<0UL,_std::multimap<unsigned_int,_spvtools::opt::Instruction_*,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::Instruction_*>_>_>_*,_false>
                   ._M_head_impl;
      uVar2 = Instruction::GetSingleWordInOperand(this_00,0);
      local_40 = (pointer)CONCAT44(local_40._4_4_,uVar2);
      local_38 = this_00;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::Instruction*>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>>
      ::_M_insert_equal<std::pair<unsigned_int_const,spvtools::opt::Instruction*>>
                (this_01,(pair<const_unsigned_int,_spvtools::opt::Instruction_*> *)&local_40);
    }
    ppIVar3 = &(this_00->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
  }
  *(undefined1 *)&this->valid_analyses_ = (char)this->valid_analyses_ | kAnalysisNameMap;
  return;
}

Assistant:

void IRContext::BuildIdToNameMap() {
  id_to_name_ = MakeUnique<std::multimap<uint32_t, Instruction*>>();
  for (Instruction& debug_inst : debugs2()) {
    if (debug_inst.opcode() == spv::Op::OpMemberName ||
        debug_inst.opcode() == spv::Op::OpName) {
      id_to_name_->insert({debug_inst.GetSingleWordInOperand(0), &debug_inst});
    }
  }
  valid_analyses_ = valid_analyses_ | kAnalysisNameMap;
}